

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftp.c
# Opt level: O2

_Bool ftp_endofresp(Curl_easy *data,connectdata *conn,char *line,size_t len,int *code)

{
  int iVar1;
  long slnum;
  
  if ((((3 < len) && ((byte)(*line - 0x30U) < 10)) && ((byte)(line[1] - 0x30U) < 10)) &&
     (((byte)(line[2] - 0x30U) < 10 && (line[3] == ' ')))) {
    slnum = strtol(line,(char **)0x0,10);
    iVar1 = curlx_sltosi(slnum);
    *code = iVar1;
    return true;
  }
  return false;
}

Assistant:

static bool ftp_endofresp(struct Curl_easy *data, struct connectdata *conn,
                          char *line, size_t len, int *code)
{
  (void)data;
  (void)conn;

  if((len > 3) && LASTLINE(line)) {
    *code = curlx_sltosi(strtol(line, NULL, 10));
    return TRUE;
  }

  return FALSE;
}